

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O0

void __thiscall branch_and_reduce_algorithm::set(branch_and_reduce_algorithm *this,int v,int a)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  reference piVar6;
  iterator iStack_f0;
  int u_1;
  iterator __end2_2;
  iterator __begin2_2;
  value_type *__range2_2;
  iterator iStack_d0;
  int nn;
  iterator __end5;
  iterator __begin5;
  value_type *__range5;
  iterator iStack_b0;
  int n_3;
  iterator __end3_1;
  iterator __begin3_1;
  value_type *__range3_1;
  iterator iStack_90;
  int n_2;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  iterator iStack_70;
  int u;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  iterator iStack_50;
  int n_1;
  iterator __end2_1;
  iterator __begin2_1;
  value_type *__range2_1;
  iterator iStack_30;
  int n;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  int a_local;
  int v_local;
  branch_and_reduce_algorithm *this_local;
  
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)v);
  if (-1 < *pvVar4) {
    __assert_fail("x[v] < 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                  ,0x8e,"void branch_and_reduce_algorithm::set(int, int)");
  }
  this->crt = a + this->crt;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)v);
  *pvVar4 = a;
  iVar2 = this->rn + -1;
  this->rn = iVar2;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->vRestore,(long)iVar2);
  *pvVar4 = v;
  if (0x13 < BRANCHING) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->partition_index,(long)v);
    if (*pvVar4 == 2) {
      this->perform_refinement = true;
    }
    pvVar5 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&this->adj,(long)v);
    __end2 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
    iStack_30 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffd0), bVar1) {
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      iVar2 = *piVar6;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar2);
      if ((*pvVar4 < 0) &&
         (pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->partition_index,(long)iVar2), *pvVar4 == 2)) {
        this->perform_refinement = true;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
  }
  if ((USE_DEPENDENCY_CHECKING & 1U) != 0) {
    pvVar5 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&this->adj,(long)v);
    __end2_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
    iStack_50 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
    while (bVar1 = __gnu_cxx::operator!=(&__end2_1,&stack0xffffffffffffffb0), bVar1) {
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2_1);
      ArraySet::Insert(&this->dc_candidates,*piVar6);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2_1);
    }
    getPackingCandidates(this,v);
  }
  if (a == 0) {
    if (0x13 < BRANCHING) {
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->adj,(long)v);
      __end3 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
      iStack_70 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
      while (bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff90), bVar1) {
        piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end3);
        pvVar5 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->adj,(long)*piVar6);
        __end4 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
        iStack_90 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
        while (bVar1 = __gnu_cxx::operator!=(&__end4,&stack0xffffffffffffff70), bVar1) {
          piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end4);
          iVar2 = *piVar6;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar2);
          if ((*pvVar4 < 0) &&
             (pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&this->partition_index,(long)iVar2), *pvVar4 == 2)) {
            this->perform_refinement = true;
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end4);
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3);
      }
    }
    if ((USE_DEPENDENCY_CHECKING & 1U) != 0) {
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->adj,(long)v);
      __end3_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
      iStack_b0 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
      while (bVar1 = __gnu_cxx::operator!=(&__end3_1,&stack0xffffffffffffff50), bVar1) {
        piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end3_1);
        iVar2 = *piVar6;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar2);
        if (*pvVar4 < 0) {
          pvVar5 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&this->adj,(long)iVar2);
          __end5 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
          iStack_d0 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
          while (bVar1 = __gnu_cxx::operator!=(&__end5,&stack0xffffffffffffff30), bVar1) {
            piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end5);
            ArraySet::Insert(&this->dc_candidates,*piVar6);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&__end5);
          }
          getPackingCandidates(this,iVar2);
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3_1);
      }
    }
    pvVar5 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&this->adj,(long)v);
    __end2_2 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
    iStack_f0 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
    while (bVar1 = __gnu_cxx::operator!=(&__end2_2,&stack0xffffffffffffff10), bVar1) {
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2_2);
      iVar2 = *piVar6;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar2);
      if (*pvVar4 < 0) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar2);
        *pvVar4 = 1;
        this->crt = this->crt + 1;
        iVar3 = this->rn + -1;
        this->rn = iVar3;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->vRestore,(long)iVar3);
        *pvVar4 = iVar2;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2_2);
    }
  }
  return;
}

Assistant:

void branch_and_reduce_algorithm::set(int v, int a)
{
    assert(x[v] < 0);
    crt += a;
    x[v] = a;
    vRestore[--rn] = v;

    if (BRANCHING >= 20){
        if (partition_index[v] == 2)
            perform_refinement = true;

        for (int n : adj[v]) {
            if (x[n] < 0 && partition_index[n] == 2)
                perform_refinement = true;
        }
    }

    if (USE_DEPENDENCY_CHECKING) {
        for (int n : adj[v]) {
            dc_candidates.Insert(n);
        }

        getPackingCandidates(v);

    }

    if (a == 0)
    {
        if (BRANCHING >= 20){
            for (int u : adj[v]) {
                for (int n : adj[u]) {
                    if (x[n] < 0 && partition_index[n] == 2)
                        perform_refinement = true;
                }
            }
        }

        if(USE_DEPENDENCY_CHECKING) {
            for (int n : adj[v]) {
                if (x[n] < 0) {
                    for (int nn : adj[n]){
                        dc_candidates.Insert(nn);
                    }                    

                    getPackingCandidates(n);
                }
            }
        }

        for (int u : adj[v])
            if (x[u] < 0)
            {
                x[u] = 1;
                crt++;
                vRestore[--rn] = u;
            }
    }
}